

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3AllocateMSI(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  void *pvVar1;
  sqlite3_uint64 in_RDX;
  long in_RDI;
  Fts3Table *pTab;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    pvVar1 = sqlite3_malloc64(in_RDX);
    *(void **)(in_RDI + 0x38) = pvVar1;
    if (*(long *)(in_RDI + 0x38) == 0) {
      return 7;
    }
  }
  memset(*(void **)(in_RDI + 0x38),0,(long)(*(int *)(in_RDX + 0x30) * 3) << 2);
  return 0;
}

Assistant:

static int fts3AllocateMSI(Fts3Expr *pExpr, int iPhrase, void *pCtx){
  Fts3Table *pTab = (Fts3Table*)pCtx;
  UNUSED_PARAMETER(iPhrase);
  if( pExpr->aMI==0 ){
    pExpr->aMI = (u32 *)sqlite3_malloc64(pTab->nColumn * 3 * sizeof(u32));
    if( pExpr->aMI==0 ) return SQLITE_NOMEM;
  }
  memset(pExpr->aMI, 0, pTab->nColumn * 3 * sizeof(u32));
  return SQLITE_OK;
}